

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O1

int zt_unit_run_by_name(zt_unit *unit,char *name)

{
  char *__s;
  char *__s_00;
  zt_unit *__s_01;
  int iVar1;
  char **__ptr;
  size_t sVar2;
  size_t sVar3;
  zt_unit *unit_00;
  zt_unit *pzVar4;
  zt_unit_test *test;
  zt_unit_suite *suite;
  int count;
  int local_34;
  
  __ptr = str_split(name,".",&local_34);
  iVar1 = -1;
  if (0xfffffffd < local_34 - 3U) {
    __s = *__ptr;
    sVar2 = strlen(__s);
    suite = (zt_unit_suite *)(unit->suites).next;
    if (suite == (zt_unit_suite *)unit) {
      suite = (zt_unit_suite *)0x0;
    }
    else {
      do {
        __s_00 = suite->name;
        sVar3 = strlen(__s_00);
        if ((sVar2 == sVar3) && (iVar1 = strncmp(__s_00,__s,sVar2), iVar1 == 0)) goto LAB_00104099;
        suite = (zt_unit_suite *)(suite->suite).next;
      } while (suite != (zt_unit_suite *)unit);
      suite = (zt_unit_suite *)0x0;
    }
LAB_00104099:
    iVar1 = -1;
    if (suite != (zt_unit_suite *)0x0) {
      if (local_34 == 1) {
        zt_unit_run_suite(unit,suite);
      }
      else {
        __s_01 = (zt_unit *)__ptr[1];
        unit_00 = __s_01;
        sVar2 = strlen((char *)__s_01);
        for (test = (zt_unit_test *)(suite->tests).next; test != (zt_unit_test *)&suite->tests;
            test = (zt_unit_test *)(test->test).next) {
          unit_00 = (zt_unit *)test->name;
          pzVar4 = unit_00;
          sVar3 = strlen((char *)unit_00);
          if ((sVar2 == sVar3) &&
             (iVar1 = strncmp((char *)unit_00,(char *)__s_01,sVar2), pzVar4 = unit_00, iVar1 == 0))
          goto LAB_0010410b;
          unit_00 = pzVar4;
        }
        test = (zt_unit_test *)0x0;
LAB_0010410b:
        iVar1 = -1;
        if (test == (zt_unit_test *)0x0) goto LAB_00104136;
        iVar1 = zt_unit_run_test(unit_00,suite,test);
        if (iVar1 == 0) {
          unit->failures = unit->failures + 1;
        }
        else {
          unit->successes = unit->successes + 1;
        }
      }
      iVar1 = 0;
    }
  }
LAB_00104136:
  if (__ptr != (char **)0x0) {
    free(__ptr);
  }
  return iVar1;
}

Assistant:

int
zt_unit_run_by_name(struct zt_unit    * unit,
                    char    * name)
{
    int                    count;
    char                 **targetv;
    struct zt_unit_suite * unit_suite = NULL;
    struct zt_unit_test  * unit_test = NULL;
    zt_elist_t           * tmp;
    int                    result = 0;
    size_t                 len;

    targetv = str_split(name, ".", &count);

    if (count <= 0 || count > 2) {
        result = -1;
        goto done;
    }

    len = strlen(targetv[0]);
    zt_elist_for_each(&unit->suites, tmp) {
        unit_suite = zt_elist_data(tmp, struct zt_unit_suite, suite);
        if (len == strlen(unit_suite->name)) {
            if (strncmp(unit_suite->name, targetv[0], len) == 0) {
                break;
            }
        }
        unit_suite = NULL;
    }

    if (unit_suite == NULL) {
        result = -1;
        goto done;
    }

    if (count == 1) {
        result = zt_unit_run_suite(unit, unit_suite);
        goto done;
    }

    len = strlen(targetv[1]);
    zt_elist_for_each(&unit_suite->tests, tmp) {
        unit_test = zt_elist_data(tmp, struct zt_unit_test, test);
        if (len == strlen(unit_test->name)) {
            if (strncmp(unit_test->name, targetv[1], len) == 0) {
                break;
            }
        }
        unit_test = NULL;
    }

    if (unit_test == NULL) {
        result = -1;
        goto done;
    }

    if (zt_unit_run_test(unit, unit_suite, unit_test) == FALSE) {
        unit->failures += 1;
    } else {
        unit->successes += 1;
    }

done:
    str_split_free(&targetv);
    return result;
}